

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  int in_EDI;
  int invalid_args;
  size_t valid_args_size;
  char *valid_args [21];
  int iters;
  int default_iters;
  int d;
  bench_data data;
  secp256k1_ecdsa_signature sig;
  secp256k1_pubkey pubkey;
  int i;
  char **in_stack_00003e18;
  int in_stack_00003e20;
  int in_stack_00003e24;
  int in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  int argc_00;
  undefined4 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  int in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  _func_void_void_ptr_int *in_stack_fffffffffffffdf8;
  _func_void_void_ptr *in_stack_fffffffffffffe00;
  _func_void_void_ptr_int *in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe20;
  char **in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  undefined4 uVar5;
  char acStack_158 [32];
  char acStack_138 [32];
  undefined1 auStack_118 [72];
  undefined8 local_d0;
  undefined1 auStack_c8 [40];
  undefined8 local_a0;
  undefined1 local_94 [64];
  undefined1 local_54 [64];
  int local_14;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  uVar1 = (uint)(in_EDI == 1);
  uVar5 = 20000;
  local_8 = in_EDI;
  get_iters(in_stack_fffffffffffffdd0);
  memcpy(&stack0xfffffffffffffde8,&DAT_00107d20,0xa8);
  argc_00 = 0x15;
  iVar2 = have_invalid_args(in_stack_fffffffffffffdf0,
                            (char **)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                            (char **)0x15,
                            CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  if (1 < local_8) {
    iVar3 = have_flag(argc_00,(char **)CONCAT44(iVar2,in_stack_fffffffffffffdd8),
                      (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    if (((iVar3 != 0) ||
        (iVar3 = have_flag(argc_00,(char **)CONCAT44(iVar2,in_stack_fffffffffffffdd8),
                           (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)),
        iVar3 != 0)) ||
       (iVar3 = have_flag(argc_00,(char **)CONCAT44(iVar2,in_stack_fffffffffffffdd8),
                          (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)),
       iVar3 != 0)) {
      help(0);
      return 0;
    }
    if (iVar2 != 0) {
      fprintf(_stderr,"./bench: unrecognized argument.\n\n");
      help(0);
      return 1;
    }
    iVar2 = 0;
  }
  iVar3 = have_flag(argc_00,(char **)CONCAT44(iVar2,in_stack_fffffffffffffdd8),
                    (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  if ((iVar3 != 0) ||
     (iVar3 = have_flag(argc_00,(char **)CONCAT44(iVar2,in_stack_fffffffffffffdd8),
                        (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)),
     iVar3 != 0)) {
    fprintf(_stderr,"./bench: Public key recovery module not enabled.\n");
    fprintf(_stderr,"Use ./configure --enable-module-recovery.\n\n");
    return 1;
  }
  uVar4 = secp256k1_context_create(1);
  for (local_14 = 0; local_14 < 0x20; local_14 = local_14 + 1) {
    acStack_158[local_14] = (char)local_14 + '\x01';
  }
  for (local_14 = 0; local_14 < 0x20; local_14 = local_14 + 1) {
    acStack_138[local_14] = (char)local_14 + '!';
  }
  local_d0 = 0x48;
  iVar3 = secp256k1_ecdsa_sign(uVar4,local_94,acStack_158,acStack_138,0);
  if (iVar3 != 0) {
    iVar3 = secp256k1_ecdsa_signature_serialize_der(uVar4,auStack_118,&local_d0,local_94);
    if (iVar3 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/bench.c"
              ,0xfa,
              "test condition failed: secp256k1_ecdsa_signature_serialize_der(data.ctx, data.sig, &data.siglen, &sig)"
             );
      abort();
    }
    iVar3 = secp256k1_ec_pubkey_create(uVar4,local_54,acStack_138);
    if (iVar3 != 0) {
      local_a0 = 0x21;
      iVar3 = secp256k1_ec_pubkey_serialize(uVar4,auStack_c8,&local_a0,local_54,0x102);
      if (iVar3 == 1) {
        print_output_table_header_row();
        if (((uVar1 != 0) ||
            (iVar3 = have_flag(argc_00,(char **)CONCAT44(iVar2,in_stack_fffffffffffffdd8),
                               (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)
                              ), iVar3 != 0)) ||
           ((iVar3 = have_flag(argc_00,(char **)CONCAT44(iVar2,in_stack_fffffffffffffdd8),
                               (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)
                              ), iVar3 != 0 ||
            (iVar3 = have_flag(argc_00,(char **)CONCAT44(iVar2,in_stack_fffffffffffffdd8),
                               (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)
                              ), iVar3 != 0)))) {
          run_benchmark(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                        in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                        (void *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                        in_stack_fffffffffffffdec,in_stack_fffffffffffffe20);
        }
        if ((((uVar1 != 0) ||
             (iVar3 = have_flag(argc_00,(char **)CONCAT44(iVar2,in_stack_fffffffffffffdd8),
                                (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0
                                                )), iVar3 != 0)) ||
            (iVar3 = have_flag(argc_00,(char **)CONCAT44(iVar2,in_stack_fffffffffffffdd8),
                               (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)
                              ), iVar3 != 0)) ||
           (iVar3 = have_flag(argc_00,(char **)CONCAT44(iVar2,in_stack_fffffffffffffdd8),
                              (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0))
           , iVar3 != 0)) {
          run_benchmark(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                        in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                        (void *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                        in_stack_fffffffffffffdec,in_stack_fffffffffffffe20);
        }
        if (((uVar1 != 0) ||
            (iVar3 = have_flag(argc_00,(char **)CONCAT44(iVar2,in_stack_fffffffffffffdd8),
                               (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)
                              ), iVar3 != 0)) ||
           ((iVar3 = have_flag(argc_00,(char **)CONCAT44(iVar2,in_stack_fffffffffffffdd8),
                               (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)
                              ), iVar3 != 0 ||
            (iVar2 = have_flag(argc_00,(char **)CONCAT44(iVar2,in_stack_fffffffffffffdd8),
                               (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)
                              ), iVar2 != 0)))) {
          run_benchmark(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                        in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                        (void *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                        in_stack_fffffffffffffdec,in_stack_fffffffffffffe20);
        }
        secp256k1_context_destroy(uVar4);
        run_ecdh_bench(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38
                      );
        run_schnorrsig_bench((int)((ulong)uVar4 >> 0x20),(int)uVar4,(char **)CONCAT44(uVar1,uVar5));
        run_ellswift_bench(in_stack_00003e24,in_stack_00003e20,in_stack_00003e18);
        return 0;
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/bench.c"
              ,0xfd,
              "test condition failed: secp256k1_ec_pubkey_serialize(data.ctx, data.pubkey, &data.pubkeylen, &pubkey, SECP256K1_EC_COMPRESSED) == 1"
             );
      abort();
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/bench.c"
            ,0xfb,"test condition failed: secp256k1_ec_pubkey_create(data.ctx, &pubkey, data.key)");
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/bench.c",
          0xf9,
          "test condition failed: secp256k1_ecdsa_sign(data.ctx, &sig, data.msg, data.key, NULL, NULL)"
         );
  abort();
}

Assistant:

int main(int argc, char** argv) {
    int i;
    secp256k1_pubkey pubkey;
    secp256k1_ecdsa_signature sig;
    bench_data data;

    int d = argc == 1;
    int default_iters = 20000;
    int iters = get_iters(default_iters);

    /* Check for invalid user arguments */
    char* valid_args[] = {"ecdsa", "verify", "ecdsa_verify", "sign", "ecdsa_sign", "ecdh", "recover",
                         "ecdsa_recover", "schnorrsig", "schnorrsig_verify", "schnorrsig_sign", "ec",
                         "keygen", "ec_keygen", "ellswift", "encode", "ellswift_encode", "decode",
                         "ellswift_decode", "ellswift_keygen", "ellswift_ecdh"};
    size_t valid_args_size = sizeof(valid_args)/sizeof(valid_args[0]);
    int invalid_args = have_invalid_args(argc, argv, valid_args, valid_args_size);

    if (argc > 1) {
        if (have_flag(argc, argv, "-h")
           || have_flag(argc, argv, "--help")
           || have_flag(argc, argv, "help")) {
            help(default_iters);
            return EXIT_SUCCESS;
        } else if (invalid_args) {
            fprintf(stderr, "./bench: unrecognized argument.\n\n");
            help(default_iters);
            return EXIT_FAILURE;
        }
    }

/* Check if the user tries to benchmark optional module without building it */
#ifndef ENABLE_MODULE_ECDH
    if (have_flag(argc, argv, "ecdh")) {
        fprintf(stderr, "./bench: ECDH module not enabled.\n");
        fprintf(stderr, "Use ./configure --enable-module-ecdh.\n\n");
        return EXIT_FAILURE;
    }
#endif

#ifndef ENABLE_MODULE_RECOVERY
    if (have_flag(argc, argv, "recover") || have_flag(argc, argv, "ecdsa_recover")) {
        fprintf(stderr, "./bench: Public key recovery module not enabled.\n");
        fprintf(stderr, "Use ./configure --enable-module-recovery.\n\n");
        return EXIT_FAILURE;
    }
#endif

#ifndef ENABLE_MODULE_SCHNORRSIG
    if (have_flag(argc, argv, "schnorrsig") || have_flag(argc, argv, "schnorrsig_sign") || have_flag(argc, argv, "schnorrsig_verify")) {
        fprintf(stderr, "./bench: Schnorr signatures module not enabled.\n");
        fprintf(stderr, "Use ./configure --enable-module-schnorrsig.\n\n");
        return EXIT_FAILURE;
    }
#endif

#ifndef ENABLE_MODULE_ELLSWIFT
    if (have_flag(argc, argv, "ellswift") || have_flag(argc, argv, "ellswift_encode") || have_flag(argc, argv, "ellswift_decode") ||
        have_flag(argc, argv, "encode") || have_flag(argc, argv, "decode") || have_flag(argc, argv, "ellswift_keygen") ||
        have_flag(argc, argv, "ellswift_ecdh")) {
        fprintf(stderr, "./bench: ElligatorSwift module not enabled.\n");
        fprintf(stderr, "Use ./configure --enable-module-ellswift.\n\n");
        return EXIT_FAILURE;
    }
#endif

    /* ECDSA benchmark */
    data.ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);

    for (i = 0; i < 32; i++) {
        data.msg[i] = 1 + i;
    }
    for (i = 0; i < 32; i++) {
        data.key[i] = 33 + i;
    }
    data.siglen = 72;
    CHECK(secp256k1_ecdsa_sign(data.ctx, &sig, data.msg, data.key, NULL, NULL));
    CHECK(secp256k1_ecdsa_signature_serialize_der(data.ctx, data.sig, &data.siglen, &sig));
    CHECK(secp256k1_ec_pubkey_create(data.ctx, &pubkey, data.key));
    data.pubkeylen = 33;
    CHECK(secp256k1_ec_pubkey_serialize(data.ctx, data.pubkey, &data.pubkeylen, &pubkey, SECP256K1_EC_COMPRESSED) == 1);

    print_output_table_header_row();
    if (d || have_flag(argc, argv, "ecdsa") || have_flag(argc, argv, "verify") || have_flag(argc, argv, "ecdsa_verify")) run_benchmark("ecdsa_verify", bench_verify, NULL, NULL, &data, 10, iters);

    if (d || have_flag(argc, argv, "ecdsa") || have_flag(argc, argv, "sign") || have_flag(argc, argv, "ecdsa_sign")) run_benchmark("ecdsa_sign", bench_sign_run, bench_sign_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "ec") || have_flag(argc, argv, "keygen") || have_flag(argc, argv, "ec_keygen")) run_benchmark("ec_keygen", bench_keygen_run, bench_keygen_setup, NULL, &data, 10, iters);

    secp256k1_context_destroy(data.ctx);

#ifdef ENABLE_MODULE_ECDH
    /* ECDH benchmarks */
    run_ecdh_bench(iters, argc, argv);
#endif

#ifdef ENABLE_MODULE_RECOVERY
    /* ECDSA recovery benchmarks */
    run_recovery_bench(iters, argc, argv);
#endif

#ifdef ENABLE_MODULE_SCHNORRSIG
    /* Schnorr signature benchmarks */
    run_schnorrsig_bench(iters, argc, argv);
#endif

#ifdef ENABLE_MODULE_ELLSWIFT
    /* ElligatorSwift benchmarks */
    run_ellswift_bench(iters, argc, argv);
#endif

    return EXIT_SUCCESS;
}